

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.c
# Opt level: O3

void setup_ignored_signals(sigaction *signal_action,int flags)

{
  int iVar1;
  
  (signal_action->__sigaction_handler).sa_handler = signal_handler;
  if ((flags & 1U) == 0) {
    iVar1 = sigaction(10,(sigaction *)signal_action,(sigaction *)0x0);
    if (iVar1 != 0) {
      throw("Error registering SIGUSR1 signal handler for server");
    }
  }
  if ((flags & 2U) == 0) {
    iVar1 = sigaction(0xc,(sigaction *)signal_action,(sigaction *)0x0);
    if (iVar1 != 0) {
      throw("Error registering SIGUSR2 signal handler for server");
    }
  }
  return;
}

Assistant:

void setup_ignored_signals(struct sigaction *signal_action, int flags) {
	// Now ignore the other signals
	signal_action->sa_handler = signal_handler;

	// Ignore SIGUSR1 ?
	if (!(flags & BLOCK_USR1)) {
		// Set signal handler
		if (sigaction(SIGUSR1, signal_action, NULL)) {
			throw("Error registering SIGUSR1 signal handler for server");
		}
	}

	// Ignore SIGUSR2 ?
	if (!(flags & BLOCK_USR2)) {
		// Set signal handler
		if (sigaction(SIGUSR2, signal_action, NULL)) {
			throw("Error registering SIGUSR2 signal handler for server");
		}
	}
}